

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::tuple_caster<std::pair,Eigen::Matrix<double,1,3,1,1,3>,double>::load_impl<0ul,1ul>
          (tuple_caster<std::pair,Eigen::Matrix<double,1,3,1,1,3>,double> *this,undefined8 *seq,
          bool convert)

{
  bool bVar1;
  bool bVar2;
  object *poVar3;
  object local_78;
  object local_70;
  accessor<pybind11::detail::accessor_policies::sequence_item> local_68;
  accessor<pybind11::detail::accessor_policies::sequence_item> local_48;
  
  local_48.obj.m_ptr = (PyObject *)*seq;
  local_48.key = 0;
  local_48.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  poVar3 = accessor<pybind11::detail::accessor_policies::sequence_item>::get_cache(&local_48);
  local_70.super_handle.m_ptr = (handle)(poVar3->super_handle).m_ptr;
  if (local_70.super_handle.m_ptr != (PyObject *)0x0) {
    ((PyObject *)local_70.super_handle.m_ptr)->ob_refcnt =
         ((PyObject *)local_70.super_handle.m_ptr)->ob_refcnt + 1;
  }
  bVar1 = type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void>::load
                    ((type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void> *)this,
                     local_70.super_handle,convert);
  local_68.obj.m_ptr = (PyObject *)*seq;
  local_68.key = 1;
  local_68.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  poVar3 = accessor<pybind11::detail::accessor_policies::sequence_item>::get_cache(&local_68);
  local_78.super_handle.m_ptr = (handle)(poVar3->super_handle).m_ptr;
  if (local_78.super_handle.m_ptr != (PyObject *)0x0) {
    ((PyObject *)local_78.super_handle.m_ptr)->ob_refcnt =
         ((PyObject *)local_78.super_handle.m_ptr)->ob_refcnt + 1;
  }
  bVar2 = type_caster<double,_void>::load
                    ((type_caster<double,_void> *)(this + 0x18),local_78.super_handle,convert);
  object::~object(&local_78);
  object::~object(&local_68.cache);
  object::~object(&local_70);
  object::~object(&local_48.cache);
  return bVar1 && bVar2;
}

Assistant:

bool load_impl(const sequence &seq, bool convert, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(subcasters).load(seq[Is], convert)...})
            if (!r)
                return false;
        return true;
    }